

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O3

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcRelFillsElement>
                 (DB *db,LIST *params,IfcRelFillsElement *in)

{
  pointer psVar1;
  TypeError *this;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcOpeningElement>_> local_71;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> local_70 [3];
  string local_40;
  
  GenericFill<Assimp::IFC::Schema_2x3::IfcRelConnects>(db,params,&in->super_IfcRelConnects);
  psVar1 = (params->members).
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x5f < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1)) {
    local_70[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar1[4].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_70[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[4].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_70[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_70[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_70[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcOpeningElement>_>::
    operator()(&local_71,
               (Lazy<Assimp::IFC::Schema_2x3::IfcOpeningElement> *)
               &(in->super_IfcRelConnects).field_0xb8,local_70,db);
    if (local_70[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70[0].
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar1[5].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_70[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[5].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_70[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_70[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_70[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>_>::operator()
              ((InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>_> *)
               &local_71,&in->RelatedBuildingElement,local_70,db);
    if (local_70[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70[0].
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return 6;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"expected 6 arguments to IfcRelFillsElement","");
  TypeError::TypeError(this,&local_40,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcRelFillsElement>(const DB& db, const LIST& params, IfcRelFillsElement* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcRelConnects*>(in));
	if (params.GetSize() < 6) { throw STEP::TypeError("expected 6 arguments to IfcRelFillsElement"); }    do { // convert the 'RelatingOpeningElement' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->RelatingOpeningElement, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 4 to IfcRelFillsElement to be a `IfcOpeningElement`")); }
    } while(0);
    do { // convert the 'RelatedBuildingElement' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->RelatedBuildingElement, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 5 to IfcRelFillsElement to be a `IfcElement`")); }
    } while(0);
	return base;
}